

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_status_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::provider::ProviderStatusTest_test_ostream_Test::TestBody
          (ProviderStatusTest_test_ostream_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  AssertHelper local_1b8;
  internal local_1b0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [8];
  string local_188 [104];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1d8._M_dataplus._M_p = (pointer)((ulong)local_1d8._M_dataplus._M_p._4_4_ << 0x20);
  pmVar3 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_1b0,"\"READY\"","ss.str()",(char (*) [6])"READY",&local_1d8);
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 2;
  pmVar3 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (local_1b0,"\"DOWN\"","ss.str()",(char (*) [5])"DOWN",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 5;
  pmVar3 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_1b0,"\"CLOSED\"","ss.str()",(char (*) [7])"CLOSED",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x2f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 3;
  pmVar3 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            (local_1b0,"\"UNAVAILABLE\"","ss.str()",(char (*) [12])"UNAVAILABLE",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 1;
  pmVar3 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_1b0,"\"DISABLED\"","ss.str()",(char (*) [9])"DISABLED",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x37,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str(local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  local_1d8._M_dataplus._M_p._0_4_ = 4;
  pmVar3 = std::
           map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bidfx_public_api::price::provider::Provider::Status>,_std::allocator<std::pair<const_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)price::provider::provider_status_map_abi_cxx11_,(key_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            (local_1b0,"\"INVALID\"","ss.str()",(char (*) [8])"INVALID",&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_1a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/provider_status_test.cpp"
               ,0x3b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((long *)local_1d8._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1d8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))();
      }
      local_1d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

TEST(ProviderStatusTest, test_ostream)
{
    std::stringstream ss;
    ss << Provider::Status::READY;
    EXPECT_EQ("READY", ss.str());

    ss.str(std::string());
    ss << Provider::Status::DOWN;
    EXPECT_EQ("DOWN", ss.str());

    ss.str(std::string());
    ss << Provider::Status::CLOSED;
    EXPECT_EQ("CLOSED", ss.str());

    ss.str(std::string());
    ss << Provider::Status::UNAVAILABLE;
    EXPECT_EQ("UNAVAILABLE", ss.str());

    ss.str(std::string());
    ss << Provider::Status::DISABLED;
    EXPECT_EQ("DISABLED", ss.str());

    ss.str(std::string());
    ss << Provider::Status::INVALID;
    EXPECT_EQ("INVALID", ss.str());
}